

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O2

uint32_t *
createDFDUnpacked(int bigEndian,int numChannels,int bytes,int redBlueSwap,VkSuffix suffix)

{
  uint uVar1;
  uint channel;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int offset;
  undefined8 local_58;
  
  iVar2 = bytes * numChannels;
  if (bigEndian == 0) {
    iVar5 = 0;
    local_58 = writeHeader(numChannels,iVar2,suffix,i_COLOR);
    if (numChannels < 1) {
      numChannels = 0;
    }
    for (uVar4 = 0; numChannels != uVar4; uVar4 = uVar4 + 1) {
      uVar1 = uVar4 ^ 2;
      if ((uVar4 & 0x7ffffffd) != 0) {
        uVar1 = uVar4;
      }
      if (redBlueSwap == 0) {
        uVar1 = uVar4;
      }
      writeSample(local_58,uVar4,uVar1,bytes * 8,iVar5,1,1,suffix);
      iVar5 = iVar5 + bytes * 8;
    }
  }
  else {
    uVar4 = 0;
    local_58 = writeHeader(iVar2,iVar2,suffix,i_COLOR);
    iVar2 = 0;
    if (0 < bytes) {
      iVar2 = bytes;
    }
    if (numChannels < 1) {
      numChannels = uVar4;
    }
    iVar5 = bytes * 8 + -8;
    for (uVar1 = 0; uVar1 != numChannels; uVar1 = uVar1 + 1) {
      channel = uVar1 ^ 2;
      if ((uVar1 & 0x7ffffffd) != 0) {
        channel = uVar1;
      }
      if (redBlueSwap == 0) {
        channel = uVar1;
      }
      offset = iVar5;
      for (iVar3 = 0; iVar2 != iVar3; iVar3 = iVar3 + 1) {
        writeSample(local_58,uVar4 + iVar3,channel,8,offset,(uint)(bytes + -1 == iVar3),
                    (uint)(iVar3 == 0),suffix);
        offset = offset + -8;
      }
      iVar5 = iVar5 + bytes * 8;
      uVar4 = uVar4 + bytes;
    }
  }
  return local_58;
}

Assistant:

uint32_t *createDFDUnpacked(int bigEndian, int numChannels, int bytes,
                            int redBlueSwap, enum VkSuffix suffix)
{
    uint32_t *DFD;
    if (bigEndian) {
        int channelCounter, channelByte;
        /* Number of samples = number of channels * bytes per channel */
        DFD = writeHeader(numChannels * bytes, numChannels * bytes, suffix, i_COLOR);
        /* First loop over the channels */
        for (channelCounter = 0; channelCounter < numChannels; ++channelCounter) {
            int channel = channelCounter;
            if (redBlueSwap && (channel == 0 || channel == 2)) {
                channel ^= 2;
            }
            /* Loop over the bytes that constitute a channel */
            for (channelByte = 0; channelByte < bytes; ++channelByte) {
                writeSample(DFD, channelCounter * bytes + channelByte, channel,
                            8, 8 * (channelCounter * bytes + bytes - channelByte - 1),
                            channelByte == bytes-1, channelByte == 0, suffix);
            }
        }

    } else { /* Little-endian */

        int sampleCounter;
        /* One sample per channel */
        DFD = writeHeader(numChannels, numChannels * bytes, suffix, i_COLOR);
        for (sampleCounter = 0; sampleCounter < numChannels; ++sampleCounter) {
            int channel = sampleCounter;
            if (redBlueSwap && (channel == 0 || channel == 2)) {
                channel ^= 2;
            }
            writeSample(DFD, sampleCounter, channel,
                        8 * bytes, 8 * sampleCounter * bytes,
                        1, 1, suffix);
        }
    }
    return DFD;
}